

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O3

bool __thiscall testing::internal::DeathTestImpl::Passed(DeathTestImpl *this,bool status_ok)

{
  ostream *poVar1;
  ostream *poVar2;
  uint uVar3;
  _Alloc_hider ss;
  int iVar4;
  size_t sVar5;
  CapturedStream **in_RDX;
  uint uVar6;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ss_00;
  bool bVar7;
  char *pcVar8;
  regmatch_t match;
  string error_message;
  string local_90;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  string local_68;
  string local_48;
  
  if (this->spawned_ != true) {
    return false;
  }
  GetCapturedStream_abi_cxx11_(&local_68,(internal *)&g_captured_stderr,in_RDX);
  Message::Message((Message *)&local_70);
  ss_00.ptr_ = local_70.ptr_;
  poVar1 = (ostream *)(local_70.ptr_ + 0x10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Death test: ",0xc);
  pcVar8 = this->statement_;
  if (pcVar8 == (char *)0x0) {
    sVar5 = 6;
    pcVar8 = "(null)";
  }
  else {
    sVar5 = strlen(pcVar8);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,pcVar8,sVar5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  switch(this->outcome_) {
  case DIED:
    if (status_ok) {
      if ((this->regex_[8] == (RE)0x1) &&
         (iVar4 = regexec((regex_t *)(this->regex_ + 0x50),local_68._M_dataplus._M_p,1,
                          (regmatch_t *)&local_90,0), iVar4 == 0)) {
        bVar7 = true;
        goto LAB_0016309f;
      }
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar1,"    Result: died but not with expected error.\n",0x2e);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"  Expected: ",0xc);
      pcVar8 = *(char **)this->regex_;
      if (pcVar8 == (char *)0x0) {
        sVar5 = 6;
        pcVar8 = "(null)";
      }
      else {
        sVar5 = strlen(pcVar8);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,pcVar8,sVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Actual msg:\n",0xc);
      FormatDeathTestOutput(&local_90,&local_68);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar1,local_90._M_dataplus._M_p,local_90._M_string_length);
      break;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,"    Result: died but not with expected exit code:\n",0x32);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"            ",0xc);
    uVar3 = this->status_;
    Message::Message((Message *)&local_48);
    ss._M_p = local_48._M_dataplus._M_p;
    uVar6 = uVar3 & 0x7f;
    if (uVar6 == 0) {
      poVar2 = (ostream *)(local_48._M_dataplus._M_p + 0x10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Exited with exit status ",0x18);
      std::ostream::operator<<((ostream *)poVar2,uVar3 >> 8 & 0xff);
    }
    else if (0x1ffffff < (int)(uVar6 * 0x1000000 + 0x1000000)) {
      poVar2 = (ostream *)(local_48._M_dataplus._M_p + 0x10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Terminated by signal ",0x15);
      std::ostream::operator<<((ostream *)poVar2,uVar6);
    }
    if ((char)uVar3 < '\0') {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(ss._M_p + 0x10)," (core dumped)",0xe);
    }
    StringStreamToString(&local_90,(stringstream *)ss._M_p);
    if ((stringstream *)ss._M_p != (stringstream *)0x0) {
      (**(code **)(*(long *)ss._M_p + 8))(ss._M_p);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,local_90._M_dataplus._M_p,local_90._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Actual msg:\n",0xc);
    FormatDeathTestOutput(&local_48,&local_68);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,local_48._M_dataplus._M_p,local_48._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    goto LAB_0016309d;
  case LIVED:
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"    Result: failed to die.\n",0x1b);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," Error msg:\n",0xc);
    FormatDeathTestOutput(&local_90,&local_68);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,local_90._M_dataplus._M_p,local_90._M_string_length);
    break;
  case RETURNED:
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,"    Result: illegal return in test statement.\n",0x2e);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," Error msg:\n",0xc);
    FormatDeathTestOutput(&local_90,&local_68);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,local_90._M_dataplus._M_p,local_90._M_string_length);
    break;
  case THREW:
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,"    Result: threw an exception.\n",0x20);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," Error msg:\n",0xc);
    FormatDeathTestOutput(&local_90,&local_68);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,local_90._M_dataplus._M_p,local_90._M_string_length);
    break;
  default:
    GTestLog::GTestLog((GTestLog *)&local_90,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kumina[P]awssyncer/contrib/googletest-release-1.8.0/googletest/src/gtest-death-test.cc"
                       ,0x246);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DeathTest::Passed somehow called before conclusion of test",
               0x3a);
    GTestLog::~GTestLog((GTestLog *)&local_90);
    local_70.ptr_ = ss_00.ptr_;
    goto LAB_0016309d;
  }
  local_70.ptr_ = ss_00.ptr_;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
LAB_0016309d:
  bVar7 = false;
  ss_00.ptr_ = local_70.ptr_;
LAB_0016309f:
  StringStreamToString(&local_90,ss_00.ptr_);
  std::__cxx11::string::_M_assign((string *)&DeathTest::last_death_test_message__abi_cxx11_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if (ss_00.ptr_ != (stringstream *)0x0) {
    (**(code **)(*(long *)ss_00.ptr_ + 8))(ss_00.ptr_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  return bVar7;
}

Assistant:

bool DeathTestImpl::Passed(bool status_ok) {
  if (!spawned())
    return false;

  const std::string error_message = GetCapturedStderr();

  bool success = false;
  Message buffer;

  buffer << "Death test: " << statement() << "\n";
  switch (outcome()) {
    case LIVED:
      buffer << "    Result: failed to die.\n"
             << " Error msg:\n" << FormatDeathTestOutput(error_message);
      break;
    case THREW:
      buffer << "    Result: threw an exception.\n"
             << " Error msg:\n" << FormatDeathTestOutput(error_message);
      break;
    case RETURNED:
      buffer << "    Result: illegal return in test statement.\n"
             << " Error msg:\n" << FormatDeathTestOutput(error_message);
      break;
    case DIED:
      if (status_ok) {
        const bool matched = RE::PartialMatch(error_message.c_str(), *regex());
        if (matched) {
          success = true;
        } else {
          buffer << "    Result: died but not with expected error.\n"
                 << "  Expected: " << regex()->pattern() << "\n"
                 << "Actual msg:\n" << FormatDeathTestOutput(error_message);
        }
      } else {
        buffer << "    Result: died but not with expected exit code:\n"
               << "            " << ExitSummary(status()) << "\n"
               << "Actual msg:\n" << FormatDeathTestOutput(error_message);
      }
      break;
    case IN_PROGRESS:
    default:
      GTEST_LOG_(FATAL)
          << "DeathTest::Passed somehow called before conclusion of test";
  }

  DeathTest::set_last_death_test_message(buffer.GetString());
  return success;
}